

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

EventLoop * __thiscall Liby::EventLoop::robinLoop1(EventLoop *this,int fd)

{
  EventLoop *pEVar1;
  
  pEVar1 = std::function<Liby::EventLoop_*(int)>::operator()(&this->rf1_,fd);
  return pEVar1;
}

Assistant:

EventLoop *EventLoop::robinLoop1(int fd) { return rf1_(fd); }